

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O2

void anon_unknown.dwarf_188c2::fillChannels(Rand48 *random,DeepImageLevel *level)

{
  uint uVar1;
  DeepImageChannel *pDVar2;
  ImageLevel *pIVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  iterator iVar7;
  Iterator IVar8;
  TypedDeepImageChannel<half> *this;
  DeepImageLevel *pDVar9;
  uint *puVar10;
  half *phVar11;
  TypedDeepImageChannel<float> *this_00;
  float *pfVar12;
  TypedDeepImageChannel<unsigned_int> *this_01;
  ulong uVar13;
  int iVar14;
  size_t i;
  long lVar15;
  double dVar16;
  Edit local_40;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"             sample counts ");
  std::endl<char,std::char_traits<char>>(poVar5);
  local_40._channel = &level->_sampleCounts;
  iVar4 = (level->_sampleCounts).super_ImageChannel._pixelsPerColumn;
  iVar14 = (level->_sampleCounts).super_ImageChannel._pixelsPerRow;
  local_40._sampleCounts = Imf_2_5::SampleCountChannel::beginEdit(local_40._channel);
  for (lVar15 = 0; iVar4 * iVar14 != lVar15; lVar15 = lVar15 + 1) {
    lVar6 = Imath_2_5::nrand48(random->_state);
    local_40._sampleCounts[lVar15] = (uint)(lVar6 % 10);
  }
  Imf_2_5::SampleCountChannel::Edit::~Edit(&local_40);
  iVar7._M_node = (_Base_ptr)Imf_2_5::DeepImageLevel::begin(level);
  do {
    IVar8 = Imf_2_5::DeepImageLevel::end(level);
    if ((iterator)iVar7._M_node == IVar8._i._M_node) {
      return;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"             channel ");
    poVar5 = std::operator<<(poVar5,(string *)(iVar7._M_node + 1));
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar4 = (**(code **)**(undefined8 **)(iVar7._M_node + 2))();
    if (iVar4 == 0) {
      pDVar2 = *(DeepImageChannel **)(iVar7._M_node + 2);
      this_01 = (TypedDeepImageChannel<unsigned_int> *)
                __dynamic_cast(pDVar2,&Imf_2_5::DeepImageChannel::typeinfo,
                               &Imf_2_5::TypedDeepImageChannel<unsigned_int>::typeinfo,0);
      if (this_01 == (TypedDeepImageChannel<unsigned_int> *)0x0) goto LAB_00112713;
      pIVar3 = (this_01->super_DeepImageChannel).super_ImageChannel._level;
      pDVar9 = Imf_2_5::DeepImageChannel::deepLevel(pDVar2);
      for (iVar4 = (pIVar3->_dataWindow).min.y; iVar4 <= (pIVar3->_dataWindow).max.y;
          iVar4 = iVar4 + 1) {
        for (iVar14 = (pIVar3->_dataWindow).min.x; iVar14 <= (pIVar3->_dataWindow).max.x;
            iVar14 = iVar14 + 1) {
          puVar10 = Imf_2_5::SampleCountChannel::at(&pDVar9->_sampleCounts,iVar14,iVar4);
          uVar1 = *puVar10;
          puVar10 = Imf_2_5::TypedDeepImageChannel<unsigned_int>::at(this_01,iVar14,iVar4);
          if ((int)uVar1 < 1) {
            uVar1 = 0;
          }
          for (uVar13 = 0; uVar1 != uVar13; uVar13 = uVar13 + 1) {
            dVar16 = Imath_2_5::Rand48::nextf(random,0.0,100.0);
            puVar10[uVar13] = (uint)(long)dVar16;
          }
        }
      }
    }
    else if (iVar4 == 2) {
      pDVar2 = *(DeepImageChannel **)(iVar7._M_node + 2);
      this_00 = (TypedDeepImageChannel<float> *)
                __dynamic_cast(pDVar2,&Imf_2_5::DeepImageChannel::typeinfo,
                               &Imf_2_5::TypedDeepImageChannel<float>::typeinfo,0);
      if (this_00 == (TypedDeepImageChannel<float> *)0x0) goto LAB_00112713;
      pIVar3 = (this_00->super_DeepImageChannel).super_ImageChannel._level;
      pDVar9 = Imf_2_5::DeepImageChannel::deepLevel(pDVar2);
      for (iVar4 = (pIVar3->_dataWindow).min.y; iVar4 <= (pIVar3->_dataWindow).max.y;
          iVar4 = iVar4 + 1) {
        for (iVar14 = (pIVar3->_dataWindow).min.x; iVar14 <= (pIVar3->_dataWindow).max.x;
            iVar14 = iVar14 + 1) {
          puVar10 = Imf_2_5::SampleCountChannel::at(&pDVar9->_sampleCounts,iVar14,iVar4);
          uVar1 = *puVar10;
          pfVar12 = Imf_2_5::TypedDeepImageChannel<float>::at(this_00,iVar14,iVar4);
          if ((int)uVar1 < 1) {
            uVar1 = 0;
          }
          for (uVar13 = 0; uVar1 != uVar13; uVar13 = uVar13 + 1) {
            dVar16 = Imath_2_5::Rand48::nextf(random,0.0,100.0);
            pfVar12[uVar13] = (float)dVar16;
          }
        }
      }
    }
    else {
      if (iVar4 != 1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                      ,0x129,"void (anonymous namespace)::fillChannels(Rand48 &, DeepImageLevel &)")
        ;
      }
      pDVar2 = *(DeepImageChannel **)(iVar7._M_node + 2);
      this = (TypedDeepImageChannel<half> *)
             __dynamic_cast(pDVar2,&Imf_2_5::DeepImageChannel::typeinfo,
                            &Imf_2_5::TypedDeepImageChannel<half>::typeinfo,0);
      if (this == (TypedDeepImageChannel<half> *)0x0) {
LAB_00112713:
        __cxa_bad_cast();
      }
      pIVar3 = (this->super_DeepImageChannel).super_ImageChannel._level;
      pDVar9 = Imf_2_5::DeepImageChannel::deepLevel(pDVar2);
      for (iVar4 = (pIVar3->_dataWindow).min.y; iVar4 <= (pIVar3->_dataWindow).max.y;
          iVar4 = iVar4 + 1) {
        for (iVar14 = (pIVar3->_dataWindow).min.x; iVar14 <= (pIVar3->_dataWindow).max.x;
            iVar14 = iVar14 + 1) {
          puVar10 = Imf_2_5::SampleCountChannel::at(&pDVar9->_sampleCounts,iVar14,iVar4);
          uVar1 = *puVar10;
          phVar11 = Imf_2_5::TypedDeepImageChannel<half>::at(this,iVar14,iVar4);
          if ((int)uVar1 < 1) {
            uVar1 = 0;
          }
          for (uVar13 = 0; uVar1 != uVar13; uVar13 = uVar13 + 1) {
            dVar16 = Imath_2_5::Rand48::nextf(random,0.0,100.0);
            half::half((half *)&local_40,(float)dVar16);
            phVar11[uVar13]._h = (unsigned_short)local_40._channel;
          }
        }
      }
    }
    iVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar7._M_node);
  } while( true );
}

Assistant:

void
fillChannels (Rand48 &random, DeepImageLevel &level)
{
    cout << "             sample counts " << endl;
    fillSampleCounts (random, level.sampleCounts());

    for (DeepImageLevel::Iterator i = level.begin(); i != level.end(); ++i)
    {
        cout << "             channel " << i.name() << endl;

        switch (i.channel().pixelType())
        {
          case HALF:
            fillChannel <half> (random, i.channel());
            break;

          case FLOAT:
            fillChannel <float> (random, i.channel());
            break;

          case UINT:
            fillChannel <unsigned int> (random, i.channel());
            break;

          default:
             assert (false);
        }
    }
}